

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_property(Integer g_a,char *property)

{
  long lVar1;
  short sVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  global_array_t *pgVar5;
  int iVar6;
  Integer *pIVar7;
  Integer IVar8;
  logical lVar9;
  Integer count;
  long lVar10;
  C_Integer *pCVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Integer status;
  Integer local_1f8;
  Integer local_1f0;
  Integer dims [7];
  Integer blk [7];
  Integer pe [7];
  Integer hi [7];
  Integer chunk [7];
  Integer lo [7];
  Integer ld [7];
  
  lVar1 = g_a + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_pgroup_sync((long)GA[lVar1].p_handle);
  if (GA[lVar1].property != 0) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  iVar6 = strcmp(property,"read_only");
  if (iVar6 != 0) {
    iVar6 = strcmp(property,"read_cache");
    pgVar5 = GA;
    if (iVar6 == 0) {
      GA[lVar1].property = 2;
      pgVar5[lVar1].cache_head = (cache_struct_t *)0x0;
      return;
    }
    pnga_error("Trying to set unknown property",0);
    return;
  }
  if (GA[lVar1].distr_type != 0) {
    pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
  }
  if (GA[lVar1].p_handle != -1) {
    pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
  }
  pgVar5 = GA;
  sVar2 = GA[lVar1].ndim;
  uVar12 = (uint)sVar2;
  uVar19 = (ulong)uVar12;
  if (sVar2 < 1) {
    iVar6 = 0;
  }
  else {
    uVar13 = 0;
    iVar6 = 0;
    do {
      iVar18 = pgVar5[g_a + 1000].nblock[uVar13];
      pgVar5[g_a + 1000].old_nblock[uVar13] = iVar18;
      pgVar5[g_a + 1000].old_lo[uVar13] = (int)pgVar5[g_a + 1000].lo[uVar13];
      pgVar5[g_a + 1000].old_chunk[uVar13] = (int)pgVar5[g_a + 1000].chunk[uVar13];
      iVar6 = iVar6 + iVar18;
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  pIVar7 = (Integer *)malloc((long)iVar6 * 8 + 8);
  pgVar5[lVar1].old_mapc = pIVar7;
  if (-1 < iVar6) {
    pCVar11 = GA[lVar1].mapc;
    pIVar7 = GA[lVar1].old_mapc;
    uVar13 = 0;
    do {
      pIVar7[uVar13] = pCVar11[uVar13];
      uVar13 = uVar13 + 1;
    } while (iVar6 + 1 != uVar13);
  }
  IVar8 = pnga_create_handle();
  pnga_set_data(IVar8,(long)(int)uVar12,GA[lVar1].dims,(long)GA[lVar1].type);
  pnga_set_pgroup(IVar8,(long)GA[lVar1].p_handle);
  lVar9 = pnga_allocate(IVar8);
  if (lVar9 == 0) {
    pnga_error("Failed to allocate temporary array",0);
  }
  local_1f0 = IVar8;
  pnga_copy(g_a,IVar8);
  GA[lVar1].old_handle = GA[lVar1].p_handle;
  IVar8 = pnga_cluster_nodeid();
  count = pnga_cluster_nprocs(IVar8);
  IVar8 = pnga_cluster_procid(IVar8,0);
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  GA_Default_Proc_Group = -1;
  ARMCI_Group_get_world((ARMCI_Group *)blk);
  ARMCI_Group_set_default((ARMCI_Group *)blk);
  pIVar7 = (Integer *)malloc(count * 8);
  auVar4 = _DAT_001b41e0;
  if (0 < count) {
    lVar14 = count + -1;
    auVar20._8_4_ = (int)lVar14;
    auVar20._0_8_ = lVar14;
    auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar13 = 0;
    auVar20 = auVar20 ^ _DAT_001b41e0;
    auVar21 = _DAT_001b41d0;
    do {
      auVar22 = auVar21 ^ auVar4;
      if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                  auVar20._4_4_ < auVar22._4_4_) & 1)) {
        pIVar7[uVar13] = uVar13 + IVar8;
      }
      if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
          auVar22._12_4_ <= auVar20._12_4_) {
        pIVar7[uVar13 + 1] = IVar8 + 1 + uVar13;
      }
      uVar13 = uVar13 + 2;
      lVar14 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar14 + 2;
    } while ((count + 1U & 0xfffffffffffffffe) != uVar13);
  }
  IVar8 = pnga_pgroup_create(pIVar7,count);
  free(pIVar7);
  pgVar5 = GA;
  GA[lVar1].p_handle = (int)IVar8;
  pgVar5[lVar1].property = 1;
  if (0 < sVar2) {
    uVar13 = 0;
    do {
      lVar14 = pgVar5[lVar1].chunk[uVar13];
      if (lVar14 != pgVar5[lVar1].dims[uVar13]) {
        lVar14 = -1;
      }
      chunk[uVar13] = lVar14;
      dims[uVar13] = pgVar5[lVar1].dims[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  if (chunk[0] == 0) {
    if (0 < sVar2) {
      memset(blk,0xff,(ulong)(uVar12 * 8));
    }
  }
  else if (0 < sVar2) {
    uVar13 = 0;
    do {
      lVar14 = dims[uVar13];
      if (chunk[uVar13] < dims[uVar13]) {
        lVar14 = chunk[uVar13];
      }
      blk[uVar13] = lVar14;
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  if (0 < sVar2) {
    uVar13 = 0;
    do {
      if (dims[uVar13] == 1) {
        blk[uVar13] = 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  ddb_h2((long)(int)uVar12,dims,(long)PGRP_LIST[IVar8].map_nproc,0.0,0,blk,pe);
  if (0 < sVar2) {
    uVar13 = 0;
    pIVar7 = mapALL;
    do {
      lVar14 = chunk[uVar13];
      lVar17 = dims[uVar13];
      if (lVar14 < 2) {
        lVar17 = lVar17 - (blk[uVar13] + -1) * pe[uVar13];
      }
      else {
        lVar15 = lVar17;
        if (lVar14 < lVar17) {
          lVar15 = lVar14;
        }
        lVar17 = (lVar17 + -1) / lVar15 + (1 - blk[uVar13]) * pe[uVar13] + 1;
      }
      lVar15 = pe[uVar13];
      if ((lVar15 < 1) || (dims[uVar13] < 1)) {
        lVar16 = 0;
      }
      else {
        lVar10 = 0;
        iVar6 = 0;
        do {
          iVar18 = (int)blk[uVar13] - (uint)(lVar17 <= lVar10);
          pIVar7[lVar10] = (long)(iVar6 + 1);
          if (1 < lVar14) {
            lVar15 = dims[uVar13];
            if (lVar14 < dims[uVar13]) {
              lVar15 = lVar14;
            }
            iVar18 = iVar18 * (int)lVar15;
          }
          lVar16 = lVar10 + 1;
          lVar15 = pe[uVar13];
          if (lVar15 <= lVar16) break;
          iVar6 = iVar6 + iVar18;
          lVar10 = lVar10 + 1;
        } while ((long)iVar6 < dims[uVar13]);
      }
      if (lVar15 < lVar16) {
        lVar16 = lVar15;
      }
      pe[uVar13] = lVar16;
      pIVar7 = pIVar7 + lVar16;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar19);
  }
  pgVar5 = GA;
  if (sVar2 < 1) {
    lVar14 = 0;
  }
  else {
    uVar13 = 0;
    lVar14 = 0;
    do {
      lVar17 = pe[uVar13];
      pgVar5[g_a + 1000].nblock[uVar13] = (int)lVar17;
      lVar14 = lVar14 + lVar17;
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  free(GA[lVar1].mapc);
  pCVar11 = (C_Integer *)malloc(lVar14 * 8 + 8);
  GA[lVar1].mapc = pCVar11;
  pIVar7 = mapALL;
  if (0 < lVar14) {
    pCVar11 = GA[lVar1].mapc;
    lVar17 = 0;
    do {
      pCVar11[lVar17] = pIVar7[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar14 != lVar17);
  }
  pgVar5 = GA;
  GA[lVar1].mapc[lVar14] = -1;
  if (0 < sVar2) {
    uVar13 = 0;
    do {
      pgVar5[g_a + 1000].scale[uVar13] =
           (double)pgVar5[g_a + 1000].nblock[uVar13] / (double)pgVar5[g_a + 1000].dims[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  pnga_distribution(g_a,GAme,pgVar5[lVar1].lo,hi);
  bVar3 = false;
  if (sVar2 < 1) {
    lVar14 = 1;
  }
  else {
    lVar14 = 1;
    bVar3 = true;
    uVar13 = 0;
    do {
      if (hi[uVar13] < GA[g_a + 1000].lo[uVar13]) {
        bVar3 = false;
      }
      lVar14 = lVar14 * ((hi[uVar13] - GA[g_a + 1000].lo[uVar13]) + 1);
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
    bVar3 = !bVar3;
  }
  lVar17 = 0;
  if (!bVar3) {
    lVar17 = GA[lVar1].elemsize * lVar14;
  }
  lVar14 = GAme;
  if (-1 < IVar8) {
    lVar14 = (long)PGRP_LIST[(int)IVar8].map_proc_list[GAme];
  }
  lVar15 = (long)GA[lVar1].old_handle;
  local_1f8 = IVar8;
  if (lVar15 < 1) {
    lVar16 = GAme;
    if (-1 < GA[lVar1].old_handle) {
      lVar16 = (long)PGRP_LIST[lVar15].map_proc_list[GAme];
    }
    ARMCI_Free(GA[lVar1].ptr[lVar16] + -GA[lVar1].id);
  }
  else {
    ARMCI_Free_group(GA[lVar1].ptr[PGRP_LIST[lVar15].map_proc_list[GAme]] + -GA[lVar1].id,
                     &PGRP_LIST[lVar15].group);
  }
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory + GA[lVar1].size;
  }
  lVar15 = GAstat.curmem - GA[lVar1].size;
  if (GA_memory_limited == '\0') {
    GAstat.curmem = lVar15 + lVar17;
    status = 1;
  }
  else {
    GA_total_memory = GA_total_memory - lVar17;
    GAstat.curmem = lVar15 + lVar17;
    status = (ulong)~GA_total_memory >> 0x3f;
    IVar8 = pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(local_1f8,IVar8,&status,1,"&&");
  }
  if (status == 0) {
    GA[lVar1].ptr[lVar14] = (char *)0x0;
  }
  else {
    uVar12 = GA[lVar1].mem_dev_set;
    if (uVar12 == 0) {
      iVar6 = gai_get_shmem(GA[lVar1].ptr,lVar17,GA[lVar1].type,&GA[lVar1].id,(int)local_1f8);
    }
    else {
      iVar6 = gai_get_devmem((char *)(ulong)uVar12,GA[lVar1].ptr,lVar17,GA[lVar1].type,&GA[lVar1].id
                             ,(int)local_1f8,uVar12,GA[lVar1].mem_dev);
    }
    status = (Integer)(iVar6 == 0);
  }
  GA[lVar1].size = lVar17;
  if (status == 0) {
    pnga_error("Memory failure when unsetting READ_ONLY",0);
  }
  pnga_distribution(g_a,GAme,lo,hi);
  IVar8 = local_1f0;
  if (0 < sVar2) {
    bVar3 = true;
    uVar13 = 0;
    do {
      ld[uVar13] = (hi[uVar13] - lo[uVar13]) + 1;
      if (hi[uVar13] < lo[uVar13]) {
        bVar3 = false;
      }
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
    if (!bVar3) goto LAB_00166e42;
  }
  pnga_get(local_1f0,lo,hi,GA[lVar1].ptr[lVar14],ld);
LAB_00166e42:
  pnga_destroy(IVar8);
  return;
}

Assistant:

void pnga_set_property(Integer g_a, char* property) {
  Integer ga_handle = g_a + GA_OFFSET;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  pnga_pgroup_sync(GA[ga_handle].p_handle);
  /* Check to see if property conflicts with properties already set on the
   * global array. This check may need more refinement as additional properties
   * are added. */
  if (GA[ga_handle].property != NO_PROPERTY) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  if (strcmp(property,"read_only")==0) {
    /* TODO: copy global array to new configuration */
    int i, d, ndim, btot, chk;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status, grp_me, g_tmp, me_local;
    Integer *list;
    Integer blk[MAXDIM], dims[MAXDIM], pe[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    Integer *pmap[MAXDIM], *map;
    char *buf;
    if (GA[ga_handle].distr_type != REGULAR) {
      pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
    }
    if (GA[ga_handle].p_handle != pnga_pgroup_get_world()) {
      pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
    }
    ndim = (int)GA[ga_handle].ndim;
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].old_nblock[i] = GA[ga_handle].nblock[i];
      GA[ga_handle].old_lo[i] = GA[ga_handle].lo[i];
      GA[ga_handle].old_chunk[i] = GA[ga_handle].chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    GA[ga_handle].old_mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].old_mapc[i] = GA[ga_handle].mapc[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].p_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    pnga_copy(g_a, g_tmp);
    /* Create a group containing all the processors on this node */
    GA[ga_handle].old_handle = GA[ga_handle].p_handle;
    nodeid = pnga_cluster_nodeid();
    nprocs = pnga_cluster_nprocs(nodeid);
    origin_id = pnga_cluster_procid(nodeid,0);
    dflt_grp = pnga_pgroup_get_default();
    pnga_pgroup_set_default(pnga_pgroup_get_world());
    list = (Integer*)malloc(nprocs*sizeof(Integer));
    for (i=0; i<nprocs; i++) {
      list[i] = origin_id+i;
    }
    handle = pnga_pgroup_create(list, nprocs);
    free(list);
    GA[ga_handle].p_handle = handle;
    GA[ga_handle].property = READ_ONLY;

    /* Ignore hints on data distribution (chunk) and just go with default
     * distribution on the node, except if chunk dimension is same as array
     * dimension (no partitioning on that axis) */
    for (i=0; i<ndim; i++) {
      /* eliminate dimension=1 from analysis, otherwise set blk to -1*/
      if (GA[ga_handle].chunk[i] == GA[ga_handle].dims[i]) {
        chunk[i] = GA[ga_handle].chunk[i];
      } else {
        chunk[i] = -1;
      }
      dims[i] = GA[ga_handle].dims[i];
    }
    if (chunk[0] != 0)
      for (d=0; d<ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for (d=0; d<ndim; d++) blk[d]=-1;
    for (d=0; d<ndim; d++) if (dims[d]==1) blk[d]=1;
    ddb_h2(ndim, dims, PGRP_LIST[handle].map_nproc,0.0,(Integer)0,blk,pe);
    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       * but respect the users block size */

      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      } else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d];
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((maplen+1)*sizeof(Integer));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
    /* Set remaining paramters and determine memory size if regular data
     * distribution is being used */

    for( i = 0; i< ndim; i++){
      GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
        / (double)GA[ga_handle].dims[i];
    }

    /*** determine which portion of the array I am supposed
     * to hold ***/
    pnga_distribution(g_a, GAme, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;
    grp_me = pnga_pgroup_nodeid(handle);
    /* Clean up old memory first */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].old_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].old_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    GAstat.curmem += mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
    } else status = 1;
    /* allocate memory */
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when unsetting READ_ONLY",0);
    }
    /* Copy data from copy of old GA to new GA and then get rid of copy*/
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      /*
      GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
      */
      ld[i] = hi[i] - lo[i] + 1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_get(g_tmp,lo,hi,GA[ga_handle].ptr[grp_me],ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (char*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      memcpy(GA[ga_handle].ptr[grp_me],buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (strcmp(property, "read_cache") == 0) {
    GA[ga_handle].property = READ_CACHE;
    GA[ga_handle].cache_head = NULL; /* (cache_struct_t *)malloc(sizeof(cache_struct_t)) */
  } else {
    pnga_error("Trying to set unknown property",0);
  }
}